

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O0

ConversionResult
llvm::ConvertUTF16toUTF8
          (UTF16 **sourceStart,UTF16 *sourceEnd,UTF8 **targetStart,UTF8 *targetEnd,
          ConversionFlags flags)

{
  UTF8 *pUVar1;
  uint uVar2;
  UTF8 *pUVar3;
  ushort *puVar4;
  UTF32 ch2;
  UTF16 *oldSource;
  UTF32 byteMark;
  UTF32 byteMask;
  unsigned_short bytesToWrite;
  UTF8 *pUStack_40;
  UTF32 ch;
  UTF8 *target;
  UTF16 *source;
  ConversionResult result;
  ConversionFlags flags_local;
  UTF8 *targetEnd_local;
  UTF8 **targetStart_local;
  UTF16 *sourceEnd_local;
  UTF16 **sourceStart_local;
  
  source._0_4_ = conversionOK;
  target = (UTF8 *)*sourceStart;
  pUStack_40 = *targetStart;
  do {
    pUVar1 = target;
    if (sourceEnd <= target) {
LAB_0028a846:
      *sourceStart = (UTF16 *)pUVar1;
      *targetStart = pUStack_40;
      return (ConversionResult)source;
    }
    puVar4 = (ushort *)(target + 2);
    byteMask = (UTF32)*(ushort *)target;
    if ((byteMask < 0xd800) || (0xdbff < byteMask)) {
      target = (UTF8 *)puVar4;
      if ((flags == strictConversion) && ((0xdbff < byteMask && (byteMask < 0xe000)))) {
        source._0_4_ = sourceIllegal;
        goto LAB_0028a846;
      }
    }
    else {
      if (sourceEnd <= puVar4) {
        source._0_4_ = sourceExhausted;
        goto LAB_0028a846;
      }
      uVar2 = (uint)*puVar4;
      if ((uVar2 < 0xdc00) || (0xdfff < uVar2)) {
        target = (UTF8 *)puVar4;
        if (flags == strictConversion) {
          source._0_4_ = sourceIllegal;
          goto LAB_0028a846;
        }
      }
      else {
        byteMask = (byteMask - 0xd800) * 0x400 + uVar2 + 0x2400;
        target = target + 4;
      }
    }
    if (byteMask < 0x80) {
      byteMark._2_2_ = 1;
    }
    else if (byteMask < 0x800) {
      byteMark._2_2_ = 2;
    }
    else if (byteMask < 0x10000) {
      byteMark._2_2_ = 3;
    }
    else if (byteMask < 0x110000) {
      byteMark._2_2_ = 4;
    }
    else {
      byteMark._2_2_ = 3;
      byteMask = 0xfffd;
    }
    pUVar3 = pUStack_40 + (int)(uint)byteMark._2_2_;
    if (targetEnd < pUVar3) {
      pUStack_40 = pUVar3 + -(long)(int)(uint)byteMark._2_2_;
      source._0_4_ = targetExhausted;
      goto LAB_0028a846;
    }
    pUStack_40 = pUVar3;
    switch(byteMark._2_2_) {
    case 4:
      pUStack_40 = pUVar3 + -1;
      pUVar3[-1] = (byte)byteMask & 0xbf | 0x80;
      byteMask = byteMask >> 6;
    case 3:
      pUStack_40[-1] = (byte)byteMask & 0xbf | 0x80;
      byteMask = byteMask >> 6;
      pUStack_40 = pUStack_40 + -1;
    case 2:
      pUStack_40[-1] = (byte)byteMask & 0xbf | 0x80;
      byteMask = byteMask >> 6;
      pUStack_40 = pUStack_40 + -1;
    case 1:
      pUStack_40[-1] = (byte)byteMask | *(byte *)((long)&firstByteMark + (ulong)byteMark._2_2_);
      pUStack_40 = pUStack_40 + -1;
    default:
      pUStack_40 = pUStack_40 + (int)(uint)byteMark._2_2_;
    }
  } while( true );
}

Assistant:

ConversionResult ConvertUTF16toUTF8 (
        const UTF16** sourceStart, const UTF16* sourceEnd,
        UTF8** targetStart, UTF8* targetEnd, ConversionFlags flags) {
    ConversionResult result = conversionOK;
    const UTF16* source = *sourceStart;
    UTF8* target = *targetStart;
    while (source < sourceEnd) {
        UTF32 ch;
        unsigned short bytesToWrite = 0;
        const UTF32 byteMask = 0xBF;
        const UTF32 byteMark = 0x80;
        const UTF16* oldSource = source; /* In case we have to back up because of target overflow. */
        ch = *source++;
        /* If we have a surrogate pair, convert to UTF32 first. */
        if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_HIGH_END) {
            /* If the 16 bits following the high surrogate are in the source buffer... */
            if (source < sourceEnd) {
                UTF32 ch2 = *source;
                /* If it's a low surrogate, convert to UTF32. */
                if (ch2 >= UNI_SUR_LOW_START && ch2 <= UNI_SUR_LOW_END) {
                    ch = ((ch - UNI_SUR_HIGH_START) << halfShift)
                        + (ch2 - UNI_SUR_LOW_START) + halfBase;
                    ++source;
                } else if (flags == strictConversion) { /* it's an unpaired high surrogate */
                    --source; /* return to the illegal value itself */
                    result = sourceIllegal;
                    break;
                }
            } else { /* We don't have the 16 bits following the high surrogate. */
                --source; /* return to the high surrogate */
                result = sourceExhausted;
                break;
            }
        } else if (flags == strictConversion) {
            /* UTF-16 surrogate values are illegal in UTF-32 */
            if (ch >= UNI_SUR_LOW_START && ch <= UNI_SUR_LOW_END) {
                --source; /* return to the illegal value itself */
                result = sourceIllegal;
                break;
            }
        }
        /* Figure out how many bytes the result will require */
        if (ch < (UTF32)0x80) {      bytesToWrite = 1;
        } else if (ch < (UTF32)0x800) {     bytesToWrite = 2;
        } else if (ch < (UTF32)0x10000) {   bytesToWrite = 3;
        } else if (ch < (UTF32)0x110000) {  bytesToWrite = 4;
        } else {                            bytesToWrite = 3;
                                            ch = UNI_REPLACEMENT_CHAR;
        }

        target += bytesToWrite;
        if (target > targetEnd) {
            source = oldSource; /* Back up source pointer! */
            target -= bytesToWrite; result = targetExhausted; break;
        }
        switch (bytesToWrite) { /* note: everything falls through. */
            case 4: *--target = (UTF8)((ch | byteMark) & byteMask); ch >>= 6;
            case 3: *--target = (UTF8)((ch | byteMark) & byteMask); ch >>= 6;
            case 2: *--target = (UTF8)((ch | byteMark) & byteMask); ch >>= 6;
            case 1: *--target =  (UTF8)(ch | firstByteMark[bytesToWrite]);
        }
        target += bytesToWrite;
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}